

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.cpp
# Opt level: O2

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* pstore::command_line::csv
            (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,string *s)

{
  ulong uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl._M_node._M_size = 0;
  uVar2 = 0;
  while( true ) {
    if (uVar2 == 0xffffffffffffffff) {
      return __return_storage_ptr__;
    }
    uVar1 = std::__cxx11::string::find((char)s,0x2c);
    if (uVar1 < uVar2) break;
    std::__cxx11::string::substr((ulong)&local_50,(ulong)s);
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    uVar2 = uVar1 + 1;
    if (uVar1 + 1 == 0) {
      uVar2 = 0xffffffffffffffff;
    }
  }
  assert_failed("epos >= spos",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/command_line/csv.cpp"
                ,0x19);
}

Assistant:

std::list<std::string> pstore::command_line::csv (std::string const & s) {
    std::list<std::string> result;
    auto spos = std::string::size_type{0};
    while (spos != std::string::npos) {
        auto const epos = s.find (',', spos);
        PSTORE_ASSERT (epos >= spos);
        result.emplace_back (s.substr (spos, epos - spos));
        spos = (epos == std::string::npos) ? epos : epos + 1;
    }
    return result;
}